

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Parser.cpp
# Opt level: O1

void __thiscall
Assimp::MD5::MD5AnimParser::MD5AnimParser(MD5AnimParser *this,SectionList *mSections)

{
  AnimBoneList *this_00;
  string *psVar1;
  char *pcVar2;
  pointer *ppBVar3;
  pointer *ppfVar4;
  pointer pSVar5;
  pointer pAVar6;
  iterator __position;
  pointer pBVar7;
  pointer pFVar8;
  pointer pEVar9;
  iterator __position_00;
  byte bVar10;
  int iVar11;
  Logger *pLVar12;
  ulong uVar13;
  byte *pbVar14;
  MD5AnimParser *in_RCX;
  char *pcVar15;
  int iVar16;
  uint uVar17;
  Assimp *this_01;
  Element *elem;
  pointer pEVar18;
  char *__src;
  size_type sVar19;
  byte *pbVar20;
  Assimp *pAVar21;
  pointer pSVar22;
  Element *elem_1;
  float f;
  undefined1 local_448 [8];
  pointer pfStack_440;
  pointer local_438;
  pointer pfStack_430;
  
  this_00 = &this->mAnimatedBones;
  (this->mFrames).
  super__Vector_base<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mFrames).
  super__Vector_base<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mBaseFrames).
  super__Vector_base<Assimp::MD5::BaseFrameDesc,_std::allocator<Assimp::MD5::BaseFrameDesc>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mBaseFrames).
  super__Vector_base<Assimp::MD5::BaseFrameDesc,_std::allocator<Assimp::MD5::BaseFrameDesc>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mAnimatedBones).
  super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mBaseFrames).
  super__Vector_base<Assimp::MD5::BaseFrameDesc,_std::allocator<Assimp::MD5::BaseFrameDesc>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mAnimatedBones).
  super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mAnimatedBones).
  super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mFrames).
  super__Vector_base<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pLVar12 = DefaultLogger::get();
  Logger::debug(pLVar12,"MD5AnimParser begin");
  this->fFrameRate = 24.0;
  this->mNumAnimatedComponents = 0xffffffff;
  pSVar22 = (mSections->
            super__Vector_base<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>)._M_impl
            .super__Vector_impl_data._M_start;
  pSVar5 = (mSections->
           super__Vector_base<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (pSVar22 == pSVar5) {
      pLVar12 = DefaultLogger::get();
      Logger::debug(pLVar12,"MD5AnimParser end");
      return;
    }
    psVar1 = &pSVar22->mName;
    iVar11 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar11 == 0) {
      pEVar9 = (pSVar22->mElements).
               super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (pEVar18 = (pSVar22->mElements).
                     super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>
                     ._M_impl.super__Vector_impl_data._M_start; pEVar18 != pEVar9;
          pEVar18 = pEVar18 + 1) {
        memset((AnimBoneDesc *)local_448,0,0x410);
        memset(local_448 + 5,0x1b,0x3ff);
        std::vector<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>::
        emplace_back<Assimp::MD5::AnimBoneDesc>(this_00,(AnimBoneDesc *)local_448);
        pAVar6 = (this->mAnimatedBones).
                 super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar14 = (byte *)(pEVar18->szStart + 2);
        __src = pEVar18->szStart;
        do {
          pcVar15 = __src;
          pbVar20 = pbVar14;
          __src = pcVar15 + 1;
          pbVar14 = pbVar20 + 1;
        } while (*pcVar15 != '\"');
        uVar17 = 0xffffffff;
        do {
          pbVar14 = pbVar20;
          uVar17 = uVar17 + 1;
          pcVar2 = pcVar15 + 1;
          pcVar15 = pcVar15 + 1;
          pbVar20 = pbVar14 + 1;
        } while (*pcVar2 != '\"');
        pAVar6[-1].super_BaseJointDescription.mName.length = uVar17;
        memcpy(pAVar6[-1].super_BaseJointDescription.mName.data,__src,(ulong)uVar17);
        *(undefined1 *)((long)pAVar6 + ((ulong)uVar17 - 0x40c)) = 0;
        for (; uVar13 = (ulong)*pbVar14, uVar13 < 0x21; pbVar14 = pbVar14 + 1) {
          if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
            if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
              MD5Parser::ReportWarning("Unexpected end of line",pEVar18->iLineNumber);
            }
            break;
          }
        }
        pbVar20 = pbVar14 + ((*pbVar14 - 0x2b & 0xfd) == 0);
        bVar10 = *pbVar20;
        iVar11 = 0;
        if (0xf5 < (byte)(bVar10 - 0x3a)) {
          iVar11 = 0;
          do {
            iVar11 = (uint)(byte)(bVar10 - 0x30) + iVar11 * 10;
            bVar10 = pbVar20[1];
            pbVar20 = pbVar20 + 1;
          } while (0xf5 < (byte)(bVar10 - 0x3a));
        }
        iVar16 = -iVar11;
        if (*pbVar14 != 0x2d) {
          iVar16 = iVar11;
        }
        pAVar6[-1].super_BaseJointDescription.mParentIndex = iVar16;
        for (; uVar13 = (ulong)*pbVar20, uVar13 < 0x21; pbVar20 = pbVar20 + 1) {
          if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
            if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
              MD5Parser::ReportWarning("Unexpected end of line",pEVar18->iLineNumber);
            }
            break;
          }
        }
        bVar10 = *pbVar20;
        uVar17 = 0;
        if (0xf5 < (byte)(bVar10 - 0x3a)) {
          uVar17 = 0;
          do {
            uVar17 = (uint)(byte)(bVar10 - 0x30) + uVar17 * 10;
            bVar10 = pbVar20[1];
            pbVar20 = pbVar20 + 1;
          } while (0xf5 < (byte)(bVar10 - 0x3a));
        }
        pAVar6[-1].iFlags = uVar17;
        pbVar14 = pbVar20;
        if (0x3f < uVar17) {
          MD5Parser::ReportWarning
                    ("Invalid flag combination in hierarchy section",pEVar18->iLineNumber);
        }
        while( true ) {
          pbVar14 = pbVar14 + 1;
          uVar13 = (ulong)*pbVar20;
          if (0x20 < uVar13) break;
          if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
            if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
              MD5Parser::ReportWarning("Unexpected end of line",pEVar18->iLineNumber);
            }
            break;
          }
          pbVar20 = pbVar20 + 1;
        }
        bVar10 = *pbVar20;
        in_RCX = (MD5AnimParser *)0x0;
        if (0xf5 < (byte)(bVar10 - 0x3a)) {
          in_RCX = (MD5AnimParser *)0x0;
          do {
            in_RCX = (MD5AnimParser *)(ulong)((uint)(byte)(bVar10 - 0x30) + (int)in_RCX * 10);
            bVar10 = *pbVar14;
            pbVar14 = pbVar14 + 1;
          } while (0xf5 < (byte)(bVar10 - 0x3a));
        }
        pAVar6[-1].iFirstKeyIndex = (uint)in_RCX;
      }
    }
    else {
      iVar11 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar11 == 0) {
        pEVar9 = (pSVar22->mElements).
                 super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pEVar18 = (pSVar22->mElements).
                       super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>
                       ._M_impl.super__Vector_impl_data._M_start; pEVar18 != pEVar9;
            pEVar18 = pEVar18 + 1) {
          pAVar21 = (Assimp *)pEVar18->szStart;
          local_448._0_4_ = 0;
          local_448[4] = '\0';
          local_448[5] = '\0';
          local_448[6] = '\0';
          local_448[7] = '\0';
          pfStack_440 = (pointer)0x0;
          local_438 = (pointer)0x0;
          __position._M_current =
               (this->mBaseFrames).
               super__Vector_base<Assimp::MD5::BaseFrameDesc,_std::allocator<Assimp::MD5::BaseFrameDesc>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->mBaseFrames).
              super__Vector_base<Assimp::MD5::BaseFrameDesc,_std::allocator<Assimp::MD5::BaseFrameDesc>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<Assimp::MD5::BaseFrameDesc,_std::allocator<Assimp::MD5::BaseFrameDesc>_>::
            _M_realloc_insert<Assimp::MD5::BaseFrameDesc>
                      (&this->mBaseFrames,__position,(BaseFrameDesc *)local_448);
          }
          else {
            ((__position._M_current)->vPositionXYZ).x = 0.0;
            ((__position._M_current)->vPositionXYZ).y = 0.0;
            *(undefined8 *)&((__position._M_current)->vPositionXYZ).z = 0;
            ((__position._M_current)->vRotationQuat).y = 0.0;
            ((__position._M_current)->vRotationQuat).z = 0.0;
            ppBVar3 = &(this->mBaseFrames).
                       super__Vector_base<Assimp::MD5::BaseFrameDesc,_std::allocator<Assimp::MD5::BaseFrameDesc>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppBVar3 = *ppBVar3 + 1;
          }
          pBVar7 = (this->mBaseFrames).
                   super__Vector_base<Assimp::MD5::BaseFrameDesc,_std::allocator<Assimp::MD5::BaseFrameDesc>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          this_01 = pAVar21;
          while( true ) {
            this_01 = this_01 + 1;
            uVar13 = (ulong)(byte)*pAVar21;
            if (0x20 < uVar13) break;
            if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
              in_RCX = (MD5AnimParser *)0x3401;
              if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                MD5Parser::ReportWarning("Unexpected end of line",pEVar18->iLineNumber);
              }
              break;
            }
            pAVar21 = pAVar21 + 1;
          }
          if (*pAVar21 != (Assimp)0x28) {
            MD5Parser::ReportWarning("Unexpected token: ( was expected",pEVar18->iLineNumber);
          }
          for (; uVar13 = (ulong)(byte)*this_01, uVar13 < 0x21; this_01 = this_01 + 1) {
            if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
              in_RCX = (MD5AnimParser *)0x3401;
              if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                MD5Parser::ReportWarning("Unexpected end of line",pEVar18->iLineNumber);
              }
              break;
            }
          }
          for (pAVar21 = (Assimp *)
                         fast_atoreal_move<float>
                                   (this_01,(char *)(pBVar7 + -1),(float *)0x1,SUB81(in_RCX,0));
              uVar13 = (ulong)(byte)*pAVar21, uVar13 < 0x21; pAVar21 = pAVar21 + 1) {
            if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
              in_RCX = (MD5AnimParser *)0x3401;
              if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                MD5Parser::ReportWarning("Unexpected end of line",pEVar18->iLineNumber);
              }
              break;
            }
          }
          for (pAVar21 = (Assimp *)
                         fast_atoreal_move<float>
                                   (pAVar21,(char *)&pBVar7[-1].vPositionXYZ.y,(float *)0x1,
                                    SUB81(in_RCX,0)); uVar13 = (ulong)(byte)*pAVar21, uVar13 < 0x21;
              pAVar21 = pAVar21 + 1) {
            if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
              in_RCX = (MD5AnimParser *)0x3401;
              if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                MD5Parser::ReportWarning("Unexpected end of line",pEVar18->iLineNumber);
              }
              break;
            }
          }
          pbVar14 = (byte *)fast_atoreal_move<float>
                                      (pAVar21,(char *)&pBVar7[-1].vPositionXYZ.z,(float *)0x1,
                                       SUB81(in_RCX,0));
          pAVar21 = (Assimp *)(pbVar14 + 2);
          for (; uVar13 = (ulong)*pbVar14, uVar13 < 0x21; pbVar14 = pbVar14 + 1) {
            if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
              in_RCX = (MD5AnimParser *)0x3401;
              if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                MD5Parser::ReportWarning("Unexpected end of line",pEVar18->iLineNumber);
              }
              break;
            }
            pAVar21 = pAVar21 + 1;
          }
          if (*pbVar14 != 0x29) {
            MD5Parser::ReportWarning("Unexpected token: ) was expected",pEVar18->iLineNumber);
          }
          for (; uVar13 = (ulong)(byte)pAVar21[-1], uVar13 < 0x21; pAVar21 = pAVar21 + 1) {
            if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
              in_RCX = (MD5AnimParser *)0x3401;
              if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                MD5Parser::ReportWarning("Unexpected end of line",pEVar18->iLineNumber);
              }
              break;
            }
          }
          if (pAVar21[-1] != (Assimp)0x28) {
            MD5Parser::ReportWarning("Unexpected token: ( was expected",pEVar18->iLineNumber);
          }
          for (; uVar13 = (ulong)(byte)*pAVar21, uVar13 < 0x21; pAVar21 = pAVar21 + 1) {
            if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
              in_RCX = (MD5AnimParser *)0x3401;
              if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                MD5Parser::ReportWarning("Unexpected end of line",pEVar18->iLineNumber);
              }
              break;
            }
          }
          for (pAVar21 = (Assimp *)
                         fast_atoreal_move<float>
                                   (pAVar21,(char *)&pBVar7[-1].vRotationQuat,(float *)0x1,
                                    SUB81(in_RCX,0)); uVar13 = (ulong)(byte)*pAVar21, uVar13 < 0x21;
              pAVar21 = pAVar21 + 1) {
            if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
              in_RCX = (MD5AnimParser *)0x3401;
              if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                MD5Parser::ReportWarning("Unexpected end of line",pEVar18->iLineNumber);
              }
              break;
            }
          }
          for (pAVar21 = (Assimp *)
                         fast_atoreal_move<float>
                                   (pAVar21,(char *)&pBVar7[-1].vRotationQuat.y,(float *)0x1,
                                    SUB81(in_RCX,0)); uVar13 = (ulong)(byte)*pAVar21, uVar13 < 0x21;
              pAVar21 = pAVar21 + 1) {
            if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
              in_RCX = (MD5AnimParser *)0x3401;
              if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                MD5Parser::ReportWarning("Unexpected end of line",pEVar18->iLineNumber);
              }
              break;
            }
          }
          for (pbVar14 = (byte *)fast_atoreal_move<float>
                                           (pAVar21,(char *)&pBVar7[-1].vRotationQuat.z,(float *)0x1
                                            ,SUB81(in_RCX,0)); uVar13 = (ulong)*pbVar14,
              uVar13 < 0x21; pbVar14 = pbVar14 + 1) {
            if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
              in_RCX = (MD5AnimParser *)0x3401;
              if ((0x3401UL >> (uVar13 & 0x3f) & 1) != 0) {
                MD5Parser::ReportWarning("Unexpected end of line",pEVar18->iLineNumber);
              }
              break;
            }
          }
          if (*pbVar14 != 0x29) {
            MD5Parser::ReportWarning("Unexpected token: ) was expected",pEVar18->iLineNumber);
          }
        }
      }
      else {
        iVar11 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar11 == 0) {
          if ((pSVar22->mGlobalValue)._M_string_length == 0) {
            MD5Parser::ReportWarning("A frame section must have a frame index",pSVar22->iLineNumber)
            ;
          }
          else {
            local_438 = (pointer)0x0;
            pfStack_430 = (pointer)0x0;
            local_448._0_4_ = 0;
            local_448[4] = '\0';
            local_448[5] = '\0';
            local_448[6] = '\0';
            local_448[7] = '\0';
            pfStack_440 = (pointer)0x0;
            std::vector<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>::
            emplace_back<Assimp::MD5::FrameDesc>(&this->mFrames,(FrameDesc *)local_448);
            if (pfStack_440 != (pointer)0x0) {
              operator_delete(pfStack_440);
            }
            pFVar8 = (this->mFrames).
                     super__Vector_base<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pbVar14 = (byte *)(pSVar22->mGlobalValue)._M_dataplus._M_p;
            in_RCX = (MD5AnimParser *)(ulong)*pbVar14;
            uVar17 = 0;
            if (0xf5 < (byte)(*pbVar14 - 0x3a)) {
              uVar17 = 0;
              do {
                pbVar14 = pbVar14 + 1;
                uVar17 = (uint)(byte)((char)in_RCX - 0x30) + uVar17 * 10;
                in_RCX = (MD5AnimParser *)(ulong)*pbVar14;
              } while (0xf5 < (byte)(*pbVar14 - 0x3a));
            }
            pFVar8[-1].iIndex = uVar17;
            if ((ulong)this->mNumAnimatedComponents != 0xffffffff) {
              std::vector<float,_std::allocator<float>_>::reserve
                        (&pFVar8[-1].mValues,(ulong)this->mNumAnimatedComponents);
            }
            pEVar18 = (pSVar22->mElements).
                      super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pEVar9 = (pSVar22->mElements).
                     super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if (pEVar18 != pEVar9) {
              do {
                pAVar21 = (Assimp *)pEVar18->szStart;
LAB_0045b072:
                while (uVar13 = (ulong)(byte)*pAVar21, 0x20 < uVar13) {
LAB_0045b097:
                  pAVar21 = (Assimp *)
                            fast_atoreal_move<float>(pAVar21,local_448,(float *)0x1,SUB81(in_RCX,0))
                  ;
                  __position_00._M_current =
                       pFVar8[-1].mValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (__position_00._M_current ==
                      pFVar8[-1].mValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                              ((vector<float,std::allocator<float>> *)&pFVar8[-1].mValues,
                               __position_00,(float *)local_448);
                  }
                  else {
                    *__position_00._M_current = (float)local_448._0_4_;
                    ppfVar4 = &pFVar8[-1].mValues.super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_finish;
                    *ppfVar4 = *ppfVar4 + 1;
                  }
                }
                in_RCX = (MD5AnimParser *)0x0;
                if ((0x100002600U >> (uVar13 & 0x3f) & 1) != 0) {
                  pAVar21 = pAVar21 + 1;
                  goto LAB_0045b072;
                }
                if (uVar13 != 0) goto LAB_0045b097;
                pEVar18 = pEVar18 + 1;
              } while (pEVar18 != pEVar9);
            }
          }
        }
        else {
          iVar11 = std::__cxx11::string::compare((char *)psVar1);
          if (iVar11 == 0) {
            pbVar14 = (byte *)(pSVar22->mGlobalValue)._M_dataplus._M_p;
            in_RCX = (MD5AnimParser *)(ulong)*pbVar14;
            if ((byte)(*pbVar14 - 0x3a) < 0xf6) {
              sVar19 = 0;
            }
            else {
              uVar17 = 0;
              do {
                pbVar14 = pbVar14 + 1;
                uVar17 = (uint)(byte)((char)in_RCX - 0x30) + uVar17 * 10;
                in_RCX = (MD5AnimParser *)(ulong)*pbVar14;
              } while (0xf5 < (byte)(*pbVar14 - 0x3a));
              sVar19 = (size_type)uVar17;
            }
            std::vector<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>::reserve
                      (&this->mFrames,sVar19);
          }
          else {
            iVar11 = std::__cxx11::string::compare((char *)psVar1);
            if (iVar11 == 0) {
              pbVar14 = (byte *)(pSVar22->mGlobalValue)._M_dataplus._M_p;
              in_RCX = (MD5AnimParser *)(ulong)*pbVar14;
              uVar17 = 0;
              if (0xf5 < (byte)(*pbVar14 - 0x3a)) {
                uVar17 = 0;
                do {
                  pbVar14 = pbVar14 + 1;
                  uVar17 = (uint)(byte)((char)in_RCX - 0x30) + uVar17 * 10;
                  in_RCX = (MD5AnimParser *)(ulong)*pbVar14;
                } while (0xf5 < (byte)(*pbVar14 - 0x3a));
              }
              std::vector<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>::
              reserve(this_00,(ulong)uVar17);
              if (this->mNumAnimatedComponents == 0xffffffff) {
                this->mNumAnimatedComponents = uVar17 * 6;
                in_RCX = this;
              }
            }
            else {
              iVar11 = std::__cxx11::string::compare((char *)psVar1);
              if (iVar11 == 0) {
                pbVar14 = (byte *)(pSVar22->mGlobalValue)._M_dataplus._M_p;
                in_RCX = (MD5AnimParser *)(ulong)*pbVar14;
                if ((byte)(*pbVar14 - 0x3a) < 0xf6) {
                  sVar19 = 0;
                }
                else {
                  uVar17 = 0;
                  do {
                    pbVar14 = pbVar14 + 1;
                    uVar17 = (uint)(byte)((char)in_RCX - 0x30) + uVar17 * 10;
                    in_RCX = (MD5AnimParser *)(ulong)*pbVar14;
                  } while (0xf5 < (byte)(*pbVar14 - 0x3a));
                  sVar19 = (size_type)uVar17;
                }
                std::vector<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>::
                reserve(this_00,sVar19);
              }
              else {
                iVar11 = std::__cxx11::string::compare((char *)psVar1);
                if (iVar11 == 0) {
                  fast_atoreal_move<float>
                            ((Assimp *)(pSVar22->mGlobalValue)._M_dataplus._M_p,(char *)this,
                             (float *)0x1,SUB81(in_RCX,0));
                }
              }
            }
          }
        }
      }
    }
    pSVar22 = pSVar22 + 1;
  } while( true );
}

Assistant:

MD5AnimParser::MD5AnimParser(SectionList& mSections)
{
    ASSIMP_LOG_DEBUG("MD5AnimParser begin");

    fFrameRate = 24.0f;
    mNumAnimatedComponents = UINT_MAX;
    for (SectionList::const_iterator iter =  mSections.begin(), iterEnd = mSections.end();iter != iterEnd;++iter) {
        if ((*iter).mName == "hierarchy")   {
            // "sheath" 0 63 6
            for (const auto & elem : (*iter).mElements) {
                mAnimatedBones.push_back ( AnimBoneDesc () );
                AnimBoneDesc& desc = mAnimatedBones.back();

                const char* sz = elem.szStart;
                AI_MD5_PARSE_STRING_IN_QUOTATION(desc.mName);
                AI_MD5_SKIP_SPACES();

                // parent index - negative values are allowed (at least -1)
                desc.mParentIndex = ::strtol10(sz,&sz);

                // flags (highest is 2^6-1)
                AI_MD5_SKIP_SPACES();
                if(63 < (desc.iFlags = ::strtoul10(sz,&sz))){
                    MD5Parser::ReportWarning("Invalid flag combination in hierarchy section",elem.iLineNumber);
                }
                AI_MD5_SKIP_SPACES();

                // index of the first animation keyframe component for this joint
                desc.iFirstKeyIndex = ::strtoul10(sz,&sz);
            }
        }
        else if((*iter).mName == "baseframe")   {
            // ( -0.000000 0.016430 -0.006044 ) ( 0.707107 0.000242 0.707107 )
            for (const auto & elem : (*iter).mElements) {
                const char* sz = elem.szStart;

                mBaseFrames.push_back ( BaseFrameDesc () );
                BaseFrameDesc& desc = mBaseFrames.back();

                AI_MD5_READ_TRIPLE(desc.vPositionXYZ);
                AI_MD5_READ_TRIPLE(desc.vRotationQuat);
            }
        }
        else if((*iter).mName ==  "frame")  {
            if (!(*iter).mGlobalValue.length()) {
                MD5Parser::ReportWarning("A frame section must have a frame index",(*iter).iLineNumber);
                continue;
            }

            mFrames.push_back ( FrameDesc () );
            FrameDesc& desc = mFrames.back();
            desc.iIndex = strtoul10((*iter).mGlobalValue.c_str());

            // we do already know how much storage we will presumably need
            if (UINT_MAX != mNumAnimatedComponents) {
                desc.mValues.reserve(mNumAnimatedComponents);
            }

            // now read all elements (continuous list of floats)
            for (const auto & elem : (*iter).mElements){
                const char* sz = elem.szStart;
                while (SkipSpacesAndLineEnd(&sz))   {
                    float f;sz = fast_atoreal_move<float>(sz,f);
                    desc.mValues.push_back(f);
                }
            }
        }
        else if((*iter).mName == "numFrames")   {
            mFrames.reserve(strtoul10((*iter).mGlobalValue.c_str()));
        }
        else if((*iter).mName == "numJoints")   {
            const unsigned int num = strtoul10((*iter).mGlobalValue.c_str());
            mAnimatedBones.reserve(num);

            // try to guess the number of animated components if that element is not given
            if (UINT_MAX  == mNumAnimatedComponents) {
                mNumAnimatedComponents = num * 6;
            }
        }
        else if((*iter).mName == "numAnimatedComponents")   {
            mAnimatedBones.reserve( strtoul10((*iter).mGlobalValue.c_str()));
        }
        else if((*iter).mName == "frameRate")   {
            fast_atoreal_move<float>((*iter).mGlobalValue.c_str(),fFrameRate);
        }
    }
    ASSIMP_LOG_DEBUG("MD5AnimParser end");
}